

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_finish(MIR_context_t ctx)

{
  MIR_module_t_conflict elem;
  void *pvVar1;
  VARR_HTAB_EL_MIR_item_t *__ptr;
  VARR_MIR_module_t *__ptr_00;
  io_ctx *piVar2;
  VARR_MIR_label_t *__ptr_01;
  VARR_uint64_t *__ptr_02;
  VARR_MIR_str_t *__ptr_03;
  VARR_MIR_type_t *__ptr_04;
  VARR_char *__ptr_05;
  VARR_MIR_proto_t *__ptr_06;
  MIR_proto_t __ptr_07;
  simplify_ctx *psVar3;
  VARR_MIR_reg_t *__ptr_08;
  VARR_HTAB_EL_val_t *__ptr_09;
  machine_code_ctx *pmVar4;
  VARR_code_holder_t *__ptr_10;
  code_holder_t *pcVar5;
  hard_reg_ctx *phVar6;
  VARR_HTAB_EL_hard_reg_desc_t *__ptr_11;
  HTAB_EL_MIR_item_t *pHVar7;
  htab_ind_t *phVar8;
  size_t sVar9;
  HTAB_EL_hard_reg_desc_t *pHVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 *puVar13;
  HTAB_MIR_item_t *pHVar14;
  ulong uVar15;
  HTAB_hard_reg_desc_t *pHVar16;
  HTAB_val_t *htab;
  MIR_item_t_conflict *ppMVar17;
  int *piVar18;
  hard_reg_desc_t hVar19;
  
  while (elem = (ctx->all_modules).head, elem != (MIR_module_t_conflict)0x0) {
    DLIST_MIR_module_t_remove(&ctx->all_modules,elem);
    remove_module(ctx,elem,1);
  }
  remove_module(ctx,&ctx->environment_module,0);
  pHVar14 = ctx->module_item_tab;
  if (pHVar14->free_func != (_func_void_MIR_item_t_void_ptr *)0x0) {
    pvVar1 = pHVar14->arg;
    pHVar7 = VARR_HTAB_EL_MIR_item_taddr(pHVar14->els);
    VARR_HTAB_EL_MIR_item_tlength(pHVar14->els);
    ppMVar17 = &pHVar7->el;
    for (uVar15 = 0; uVar15 < pHVar14->els_bound; uVar15 = uVar15 + 1) {
      if (((HTAB_EL_MIR_item_t *)(ppMVar17 + -1))->hash != 0) {
        (*pHVar14->free_func)(*ppMVar17,pvVar1);
      }
      ppMVar17 = ppMVar17 + 2;
    }
    pHVar14->els_bound = 0;
    pHVar14->els_num = 0;
    pHVar14->els_start = 0;
    phVar8 = VARR_htab_ind_taddr(pHVar14->entries);
    sVar9 = VARR_htab_ind_tlength(pHVar14->entries);
    for (uVar15 = 0; (sVar9 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
      phVar8[uVar15] = 0xffffffff;
    }
    pHVar14 = ctx->module_item_tab;
  }
  __ptr = pHVar14->els;
  if ((__ptr == (VARR_HTAB_EL_MIR_item_t *)0x0) || (__ptr->varr == (HTAB_EL_MIR_item_t *)0x0)) {
    mir_varr_assert_fail("destroy","HTAB_EL_MIR_item_t");
  }
  free(__ptr->varr);
  free(__ptr);
  pHVar14->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
  VARR_htab_ind_tdestroy(&ctx->module_item_tab->entries);
  free(ctx->module_item_tab);
  ctx->module_item_tab = (HTAB_MIR_item_t *)0x0;
  __ptr_00 = ctx->modules_to_link;
  if ((__ptr_00 == (VARR_MIR_module_t *)0x0) || (__ptr_00->varr == (MIR_module_t_conflict *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_module_t");
  }
  free(__ptr_00->varr);
  free(__ptr_00);
  ctx->modules_to_link = (VARR_MIR_module_t *)0x0;
  VARR_MIR_op_tdestroy(&ctx->temp_ops);
  piVar2 = ctx->io_ctx;
  __ptr_01 = piVar2->func_labels;
  if ((__ptr_01 == (VARR_MIR_label_t *)0x0) || (__ptr_01->varr == (MIR_label_t *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_label_t");
  }
  free(__ptr_01->varr);
  free(__ptr_01);
  piVar2->func_labels = (VARR_MIR_label_t *)0x0;
  piVar2 = ctx->io_ctx;
  __ptr_02 = piVar2->insn_label_string_nums;
  if ((__ptr_02 == (VARR_uint64_t *)0x0) || (__ptr_02->varr == (uint64_t *)0x0)) {
    mir_varr_assert_fail("destroy","uint64_t");
  }
  free(__ptr_02->varr);
  free(__ptr_02);
  piVar2->insn_label_string_nums = (VARR_uint64_t *)0x0;
  piVar2 = ctx->io_ctx;
  __ptr_03 = piVar2->bin_strings;
  if ((__ptr_03 == (VARR_MIR_str_t *)0x0) || (__ptr_03->varr == (MIR_str_t *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_str_t");
  }
  free(__ptr_03->varr);
  free(__ptr_03);
  piVar2->bin_strings = (VARR_MIR_str_t *)0x0;
  VARR_MIR_op_tdestroy(&ctx->io_ctx->read_insn_ops);
  VARR_MIR_var_tdestroy(&ctx->io_ctx->proto_vars);
  piVar2 = ctx->io_ctx;
  __ptr_04 = piVar2->proto_types;
  if ((__ptr_04 == (VARR_MIR_type_t *)0x0) || (__ptr_04->varr == (MIR_type_t *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_type_t");
  }
  free(__ptr_04->varr);
  free(__ptr_04);
  piVar2->proto_types = (VARR_MIR_type_t *)0x0;
  free(ctx->io_ctx);
  ctx->io_ctx = (io_ctx *)0x0;
  VARR_uint8_tdestroy(&ctx->temp_data);
  VARR_uint8_tdestroy(&ctx->used_label_p);
  __ptr_05 = ctx->temp_string;
  if ((__ptr_05 == (VARR_char *)0x0) || (__ptr_05->varr == (char *)0x0)) {
    mir_varr_assert_fail("destroy","char");
  }
  free(__ptr_05->varr);
  free(__ptr_05);
  ctx->temp_string = (VARR_char *)0x0;
  while( true ) {
    sVar9 = VARR_MIR_proto_tlength(ctx->unspec_protos);
    __ptr_06 = ctx->unspec_protos;
    if (sVar9 == 0) break;
    if (((__ptr_06 == (VARR_MIR_proto_t *)0x0) || (__ptr_06->varr == (MIR_proto_t *)0x0)) ||
       (sVar9 = __ptr_06->els_num, sVar9 == 0)) {
      pcVar12 = "pop";
      goto LAB_0010fe4e;
    }
    __ptr_06->els_num = sVar9 - 1;
    __ptr_07 = __ptr_06->varr[sVar9 - 1];
    VARR_MIR_var_tdestroy(&__ptr_07->args);
    free(__ptr_07);
  }
  if ((__ptr_06 == (VARR_MIR_proto_t *)0x0) || (__ptr_06->varr == (MIR_proto_t *)0x0)) {
    pcVar12 = "destroy";
LAB_0010fe4e:
    mir_varr_assert_fail(pcVar12,"MIR_proto_t");
  }
  free(__ptr_06->varr);
  free(__ptr_06);
  ctx->unspec_protos = (VARR_MIR_proto_t *)0x0;
  string_finish(&ctx->string_ctx->strings,&ctx->string_ctx->string_tab);
  string_finish(&ctx->alias_ctx->aliases,&ctx->alias_ctx->alias_tab);
  VARR_size_tdestroy(&ctx->simplify_ctx->alloca_sizes);
  VARR_MIR_insn_tdestroy(&ctx->simplify_ctx->anchors);
  psVar3 = ctx->simplify_ctx;
  __ptr_08 = psVar3->inline_reg_map;
  if ((__ptr_08 == (VARR_MIR_reg_t *)0x0) || (__ptr_08->varr == (MIR_reg_t *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_reg_t");
  }
  free(__ptr_08->varr);
  free(__ptr_08);
  psVar3->inline_reg_map = (VARR_MIR_reg_t *)0x0;
  VARR_MIR_insn_tdestroy(&ctx->simplify_ctx->labels);
  VARR_MIR_insn_tdestroy(&ctx->simplify_ctx->temp_insns);
  VARR_MIR_insn_tdestroy(&ctx->simplify_ctx->cold_insns);
  psVar3 = ctx->simplify_ctx;
  htab = psVar3->val_tab;
  if (htab->free_func != (_func_void_val_t_void_ptr *)0x0) {
    HTAB_val_t_clear(htab);
    htab = psVar3->val_tab;
  }
  __ptr_09 = htab->els;
  if ((__ptr_09 == (VARR_HTAB_EL_val_t *)0x0) || (__ptr_09->varr == (HTAB_EL_val_t *)0x0)) {
    mir_varr_assert_fail("destroy","HTAB_EL_val_t");
  }
  free(__ptr_09->varr);
  free(__ptr_09);
  htab->els = (VARR_HTAB_EL_val_t *)0x0;
  VARR_htab_ind_tdestroy(&psVar3->val_tab->entries);
  free(psVar3->val_tab);
  psVar3->val_tab = (HTAB_val_t *)0x0;
  free(ctx->simplify_ctx);
  ctx->simplify_ctx = (simplify_ctx *)0x0;
  VARR_size_tdestroy(&ctx->insn_nops);
  do {
    sVar9 = VARR_code_holder_tlength(ctx->machine_code_ctx->code_holders);
    pmVar4 = ctx->machine_code_ctx;
    __ptr_10 = pmVar4->code_holders;
    if (sVar9 == 0) {
      if ((__ptr_10 != (VARR_code_holder_t *)0x0) && (__ptr_10->varr != (code_holder_t *)0x0)) {
        free(__ptr_10->varr);
        free(__ptr_10);
        pmVar4->code_holders = (VARR_code_holder_t *)0x0;
        free(ctx->machine_code_ctx);
        ctx->machine_code_ctx = (machine_code_ctx *)0x0;
        phVar6 = ctx->hard_reg_ctx;
        pHVar16 = phVar6->hard_reg_desc_tab;
        if (pHVar16->free_func != (_func_void_hard_reg_desc_t_void_ptr *)0x0) {
          pvVar1 = pHVar16->arg;
          pHVar10 = VARR_HTAB_EL_hard_reg_desc_taddr(pHVar16->els);
          VARR_HTAB_EL_hard_reg_desc_tlength(pHVar16->els);
          piVar18 = &(pHVar10->el).num;
          for (uVar15 = 0; uVar15 < pHVar16->els_bound; uVar15 = uVar15 + 1) {
            if (piVar18[-4] != 0) {
              hVar19.num = *piVar18;
              hVar19.name = ((hard_reg_desc_t *)(piVar18 + -2))->name;
              hVar19._12_4_ = 0;
              (*pHVar16->free_func)(hVar19,pvVar1);
            }
            piVar18 = piVar18 + 6;
          }
          pHVar16->els_bound = 0;
          pHVar16->els_num = 0;
          pHVar16->els_start = 0;
          phVar8 = VARR_htab_ind_taddr(pHVar16->entries);
          sVar9 = VARR_htab_ind_tlength(pHVar16->entries);
          for (uVar15 = 0; (sVar9 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
            phVar8[uVar15] = 0xffffffff;
          }
          pHVar16 = phVar6->hard_reg_desc_tab;
        }
        __ptr_11 = pHVar16->els;
        if ((__ptr_11 == (VARR_HTAB_EL_hard_reg_desc_t *)0x0) ||
           (__ptr_11->varr == (HTAB_EL_hard_reg_desc_t *)0x0)) {
          mir_varr_assert_fail("destroy","HTAB_EL_hard_reg_desc_t");
        }
        free(__ptr_11->varr);
        free(__ptr_11);
        pHVar16->els = (VARR_HTAB_EL_hard_reg_desc_t *)0x0;
        VARR_htab_ind_tdestroy(&phVar6->hard_reg_desc_tab->entries);
        free(phVar6->hard_reg_desc_tab);
        phVar6->hard_reg_desc_tab = (HTAB_hard_reg_desc_t *)0x0;
        free(ctx->hard_reg_ctx);
        ctx->hard_reg_ctx = (hard_reg_ctx *)0x0;
        if (ctx->curr_func == (MIR_func_t)0x0) {
          if (ctx->curr_module == (MIR_module_t_conflict)0x0) {
            free(ctx->string_ctx);
            free(ctx->alias_ctx);
            free(ctx);
            return;
          }
          pcVar12 = ctx->curr_module->name;
          pcVar11 = "finish when module %s is not finished";
        }
        else {
          pcVar12 = ctx->curr_func->name;
          pcVar11 = "finish when function %s is not finished";
        }
        puVar13 = (undefined8 *)0x4;
        (*ctx->error_func)(MIR_finish_error,pcVar11,pcVar12);
        pvVar1 = (void *)*puVar13;
        if ((pvVar1 != (void *)0x0) && (*(void **)((long)pvVar1 + 0x10) != (void *)0x0)) {
          free(*(void **)((long)pvVar1 + 0x10));
          free(pvVar1);
          *puVar13 = 0;
          return;
        }
        mir_varr_assert_fail("destroy","MIR_op_t");
      }
      pcVar12 = "destroy";
LAB_0010fe61:
      mir_varr_assert_fail(pcVar12,"code_holder_t");
    }
    if (((__ptr_10 == (VARR_code_holder_t *)0x0) ||
        (pcVar5 = __ptr_10->varr, pcVar5 == (code_holder_t *)0x0)) || (__ptr_10->els_num == 0)) {
      pcVar12 = "pop";
      goto LAB_0010fe61;
    }
    sVar9 = __ptr_10->els_num - 1;
    __ptr_10->els_num = sVar9;
    munmap(pcVar5[sVar9].start,(long)pcVar5[sVar9].bound - (long)pcVar5[sVar9].start);
  } while( true );
}

Assistant:

void MIR_finish (MIR_context_t ctx) {
  interp_finish (ctx);
  remove_all_modules (ctx);
  HTAB_DESTROY (MIR_item_t, module_item_tab);
  VARR_DESTROY (MIR_module_t, modules_to_link);
  VARR_DESTROY (MIR_op_t, temp_ops);
#if !MIR_NO_SCAN
  scan_finish (ctx);
#endif
#if !MIR_NO_IO
  io_finish (ctx);
#endif
  VARR_DESTROY (uint8_t, temp_data);
  VARR_DESTROY (uint8_t, used_label_p);
  VARR_DESTROY (char, temp_string);
  while (VARR_LENGTH (MIR_proto_t, unspec_protos) != 0) {
    MIR_proto_t proto = VARR_POP (MIR_proto_t, unspec_protos);
    VARR_DESTROY (MIR_var_t, proto->args);
    free (proto);
  }
  VARR_DESTROY (MIR_proto_t, unspec_protos);
  string_finish (&strings, &string_tab);
  string_finish (&aliases, &alias_tab);
  simplify_finish (ctx);
  VARR_DESTROY (size_t, insn_nops);
  code_finish (ctx);
  hard_reg_name_finish (ctx);
  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when function %s is not finished",
                              curr_func->name);
  if (curr_module != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when module %s is not finished",
                              curr_module->name);
  free (ctx->string_ctx);
  free (ctx->alias_ctx);
  free (ctx);
  ctx = NULL;
}